

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::AlwaysTrue(void)

{
  bool bVar1;
  undefined8 uVar2;
  
  bVar1 = IsTrue(false);
  if (!bVar1) {
    return true;
  }
  uVar2 = __cxa_allocate_exception(1);
  __cxa_throw(uVar2,&(anonymous_namespace)::ClassUniqueToAlwaysTrue::typeinfo,0);
}

Assistant:

bool AlwaysTrue() {
#if GTEST_HAS_EXCEPTIONS
  // This condition is always false so AlwaysTrue() never actually throws,
  // but it makes the compiler think that it may throw.
  if (IsTrue(false))
    throw ClassUniqueToAlwaysTrue();
#endif  // GTEST_HAS_EXCEPTIONS
  return true;
}